

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::MapFieldBase::MergeFrom(MapFieldBase *this,MapFieldBase *other)

{
  if (((this->super_MapFieldBaseForParse).payload_._M_i & 1) != 0) {
    (*MapFieldBaseForParse::sync_map_with_repeated)(this,1);
  }
  if (((other->super_MapFieldBaseForParse).payload_._M_i & 1) != 0) {
    (*MapFieldBaseForParse::sync_map_with_repeated)(other,0);
  }
  UntypedMapBase::UntypedMergeFrom((UntypedMapBase *)(this + 1),(UntypedMapBase *)(other + 1));
  return;
}

Assistant:

void MapFieldBase::MergeFrom(const MapFieldBase& other) {
  MutableMap()->UntypedMergeFrom(other.GetMap());
}